

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O1

void calcBias<Blob<448>,Blob<256>>
               (pfHash hash,vector<int,_std::allocator<int>_> *counts,int reps,Rand *r,bool verbose)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  int *piVar5;
  int iBit;
  uint32_t bit;
  int iOut;
  uint32_t bit_00;
  Blob<448> K;
  Blob<256> B;
  Blob<256> A;
  undefined1 local_b8 [24];
  undefined8 local_a0;
  undefined1 auStack_98 [24];
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  
  auStack_98 = ZEXT824(0);
  local_b8._16_8_ = 0;
  local_b8._0_16_ = ZEXT816(0) << 0x40;
  local_a0 = 0;
  local_78 = ZEXT1632(ZEXT816(0) << 0x40);
  if (0 < reps) {
    uVar4 = 0;
    local_58 = local_78;
    do {
      if ((verbose) && ((int)(uVar4 % ((ulong)(uint)reps / 10)) == 0)) {
        putchar(0x2e);
      }
      Rand::rand_p(r,local_b8,0x38);
      bit = 0;
      (*hash)(local_b8,0x38,0,local_58);
      piVar5 = (counts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      do {
        flipbit(local_b8,0x38,bit);
        (*hash)(local_b8,0x38,0,local_78);
        flipbit(local_b8,0x38,bit);
        bit_00 = 0;
        do {
          uVar1 = getbit(local_58,0x20,bit_00);
          uVar2 = getbit(local_78,0x20,bit_00);
          *piVar5 = *piVar5 + (uVar2 ^ uVar1);
          piVar5 = piVar5 + 1;
          bit_00 = bit_00 + 1;
        } while (bit_00 != 0x100);
        bit = bit + 1;
      } while (bit != 0x1c0);
      uVar3 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar3;
    } while (uVar3 != reps);
  }
  return;
}

Assistant:

void calcBias ( pfHash hash, std::vector<int> & counts, int reps, Rand & r, bool verbose )
{
  const int keybytes = sizeof(keytype);
  const int hashbytes = sizeof(hashtype);

  const int keybits = keybytes * 8;
  const int hashbits = hashbytes * 8;

  keytype K;
  hashtype A,B;

  for(int irep = 0; irep < reps; irep++)
  {
    if(verbose) {
      if(irep % (reps/10) == 0) printf(".");
    }

    r.rand_p(&K,keybytes);

    hash(&K,keybytes,0,&A);

    int * cursor = &counts[0];

    for(int iBit = 0; iBit < keybits; iBit++)
    {
      flipbit(&K,keybytes,iBit);
      hash(&K,keybytes,0,&B);
      flipbit(&K,keybytes,iBit);

      for(int iOut = 0; iOut < hashbits; iOut++)
      {
        int bitA = getbit(&A,hashbytes,iOut);
        int bitB = getbit(&B,hashbytes,iOut);

        (*cursor++) += (bitA ^ bitB);
      }
    }
  }
}